

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O0

void lj_trace_hot(jit_State *J,BCIns *pc)

{
  int *piVar1;
  jit_State *in_RSI;
  long in_RDI;
  int olderr;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  piVar1 = __errno_location();
  iVar2 = *piVar1;
  *(short *)(in_RDI + 0x9a0 + (ulong)((uint)((ulong)in_RSI >> 2) & 0x3f) * 2) =
       (short)(*(int *)(in_RDI + 0x60c) << 1);
  if ((*(int *)(in_RDI + 0xbc) == 0) && ((*(byte *)(in_RDI + -0x107) & 0x60) == 0)) {
    *(undefined4 *)(in_RDI + 0x958) = 0;
    *(undefined4 *)(in_RDI + 0x95c) = 0;
    *(undefined4 *)(in_RDI + 0xbc) = 0x12;
    lj_trace_ins(in_RSI,(BCIns *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
  }
  piVar1 = __errno_location();
  *piVar1 = iVar2;
  return;
}

Assistant:

void LJ_FASTCALL lj_trace_hot(jit_State *J, const BCIns *pc)
{
  /* Note: pc is the interpreter bytecode PC here. It's offset by 1. */
  ERRNO_SAVE
  /* Reset hotcount. */
  hotcount_set(J2GG(J), pc, J->param[JIT_P_hotloop]*HOTCOUNT_LOOP);
  /* Only start a new trace if not recording or inside __gc call or vmevent. */
  if (J->state == LJ_TRACE_IDLE &&
      !(J2G(J)->hookmask & (HOOK_GC|HOOK_VMEVENT))) {
    J->parent = 0;  /* Root trace. */
    J->exitno = 0;
    J->state = LJ_TRACE_START;
    lj_trace_ins(J, pc-1);
  }
  ERRNO_RESTORE
}